

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.c
# Opt level: O0

int quicly_sentmap_update
              (quicly_sentmap_t *map,quicly_sentmap_iter_t *iter,quicly_sentmap_event_t event)

{
  long lVar1;
  undefined8 uVar2;
  uint uVar3;
  int in_EDX;
  long *in_RSI;
  long in_RDI;
  int should_discard;
  int should_notify;
  int ret;
  quicly_sent_packet_t packet;
  quicly_sentmap_iter_t *in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffc0;
  undefined1 uVar4;
  bool bVar5;
  undefined1 uVar6;
  int local_34;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  int local_14;
  long *local_10;
  long local_8;
  
  local_34 = 0;
  if ((quicly_sent_t *)*in_RSI == &quicly_sentmap__end_iter) {
    __assert_fail("iter->p != &quicly_sentmap__end_iter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sentmap.c"
                  ,0x89,
                  "int quicly_sentmap_update(quicly_sentmap_t *, quicly_sentmap_iter_t *, quicly_sentmap_event_t)"
                 );
  }
  if (*(code **)*in_RSI != quicly_sentmap__type_packet) {
    __assert_fail("iter->p->acked == quicly_sentmap__type_packet",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sentmap.c"
                  ,0x8a,
                  "int quicly_sentmap_update(quicly_sentmap_t *, quicly_sentmap_iter_t *, quicly_sentmap_event_t)"
                 );
  }
  lVar1 = *in_RSI;
  local_30 = *(undefined8 *)(lVar1 + 8);
  local_28 = *(undefined8 *)(lVar1 + 0x10);
  uVar2 = *(undefined8 *)(lVar1 + 0x18);
  local_20._2_2_ = (ushort)((ulong)uVar2 >> 0x10);
  local_20 = uVar2;
  if ((local_20._2_2_ != 0) && (in_EDX != 1)) {
    if (*(ulong *)(in_RDI + 0x18) < (ulong)local_20._2_2_) {
      __assert_fail("map->bytes_in_flight >= packet.cc_bytes_in_flight",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sentmap.c"
                    ,0x91,
                    "int quicly_sentmap_update(quicly_sentmap_t *, quicly_sentmap_iter_t *, quicly_sentmap_event_t)"
                   );
    }
    *(ulong *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) - (ulong)local_20._2_2_;
    *(undefined2 *)(*in_RSI + 0x1a) = 0;
  }
  *(byte *)(*in_RSI + 0x19) = *(byte *)(*in_RSI + 0x19) & 0xfd;
  bVar5 = true;
  if (in_EDX != 0) {
    local_20._1_1_ = (byte)((ulong)uVar2 >> 8);
    bVar5 = (local_20._1_1_ >> 1 & 1) != 0;
  }
  uVar4 = in_EDX == 0 || in_EDX == 3;
  uVar3 = (uint)(byte)uVar4;
  uVar6 = bVar5;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (uVar3 != 0) {
    discard_entry((quicly_sentmap_t *)
                  (ulong)CONCAT14(uVar4,CONCAT13(bVar5,CONCAT12(uVar4,in_stack_ffffffffffffffc0))),
                  in_stack_ffffffffffffffb8);
    *(long *)(local_8 + 0x10) = *(long *)(local_8 + 0x10) + -1;
  }
  next_entry((quicly_sentmap_iter_t *)0x15f9a8);
  while ((*(code **)*local_10 != quicly_sentmap__type_packet &&
         ((bVar5 == false ||
          (local_34 = (**(code **)*local_10)(local_8,&local_30,local_14 == 0,*local_10),
          local_34 == 0))))) {
    if (uVar3 != 0) {
      discard_entry((quicly_sentmap_t *)
                    CONCAT44(uVar3,CONCAT13(uVar6,CONCAT12(uVar4,in_stack_ffffffffffffffc0))),
                    in_stack_ffffffffffffffb8);
    }
    next_entry((quicly_sentmap_iter_t *)0x15fa1d);
  }
  return local_34;
}

Assistant:

int quicly_sentmap_update(quicly_sentmap_t *map, quicly_sentmap_iter_t *iter, quicly_sentmap_event_t event)
{
    quicly_sent_packet_t packet;
    int ret = 0;

    assert(iter->p != &quicly_sentmap__end_iter);
    assert(iter->p->acked == quicly_sentmap__type_packet);

    /* copy packet info */
    packet = iter->p->data.packet;

    /* update CC state unless the event is PTO */
    if (packet.cc_bytes_in_flight != 0 && event != QUICLY_SENTMAP_EVENT_PTO) {
        assert(map->bytes_in_flight >= packet.cc_bytes_in_flight);
        map->bytes_in_flight -= packet.cc_bytes_in_flight;
        iter->p->data.packet.cc_bytes_in_flight = 0;
    }
    iter->p->data.packet.frames_in_flight = 0;

    int should_notify = event == QUICLY_SENTMAP_EVENT_ACKED || packet.frames_in_flight,
        should_discard = event == QUICLY_SENTMAP_EVENT_ACKED || event == QUICLY_SENTMAP_EVENT_EXPIRED;

    /* Advance to next packet, while if necessary, doing either or both of the following:
     * * discard entries (if should_discard is set)
     * * invoke the frame-level callbacks (if should_notify is set) */
    if (should_discard) {
        discard_entry(map, iter);
        --map->num_packets;
    }
    for (next_entry(iter); iter->p->acked != quicly_sentmap__type_packet; next_entry(iter)) {
        if (should_notify && (ret = iter->p->acked(map, &packet, event == QUICLY_SENTMAP_EVENT_ACKED, iter->p)) != 0)
            goto Exit;
        if (should_discard)
            discard_entry(map, iter);
    }

Exit:
    return ret;
}